

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int fits_copy_image2cell
              (fitsfile *fptr,fitsfile *newptr,char *colname,long rownum,int copykeyflag,int *status
              )

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  long local_7e10;
  long local_7e00;
  char *local_7dd8;
  char *patterns [43] [2];
  LONGLONG dataend;
  LONGLONG datastart;
  LONGLONG headstart;
  uchar dummy;
  int typecode1;
  LONGLONG width1;
  LONGLONG repeat1;
  LONGLONG naxes1 [9];
  int naxis1;
  int npat;
  char filename [1045];
  long local_7688;
  LONGLONG firstbyte;
  LONGLONG ntodo;
  LONGLONG repeat;
  LONGLONG nbytes;
  LONGLONG naxes [9];
  LONGLONG imgstart;
  char card [81];
  char local_75b8 [8];
  char tform [20];
  char local_7599;
  int local_7598;
  int iStack_7594;
  char tformchar;
  int hdunum;
  int ncols;
  int naxis;
  int bitpix;
  int typecode;
  int colnum;
  int hdutype;
  int ii;
  uchar buffer [30000];
  tcolumn *colptr;
  int *status_local;
  int copykeyflag_local;
  long rownum_local;
  char *colname_local;
  fitsfile *newptr_local;
  fitsfile *fptr_local;
  
  memset(&repeat1,0,0x48);
  headstart._3_1_ = 0;
  memcpy(&local_7dd8,&PTR_anon_var_dwarf_172a_002b6c90,0x2b0);
  if (*status < 1) {
    if ((fptr == (fitsfile *)0x0) || (newptr == (fitsfile *)0x0)) {
      *status = 0x73;
      fptr_local._4_4_ = 0x73;
    }
    else {
      iVar2 = ffghdt(fptr,&typecode,status);
      if (iVar2 < 1) {
        if (typecode == 0) {
          iVar2 = ffghdt(newptr,&typecode,status);
          if (iVar2 < 1) {
            if (typecode == 2) {
              iVar2 = ffgiprll(fptr,9,&ncols,&hdunum,&nbytes,status);
              if (iVar2 < 1) {
                ntodo = 1;
                for (colnum = 0; colnum < hdunum; colnum = colnum + 1) {
                  ntodo = naxes[(long)colnum + -1] * ntodo;
                }
                if (ncols == 8) {
                  naxis = 0xb;
                  local_7599 = 'B';
                  repeat = ntodo;
                }
                else if (ncols == 0x10) {
                  naxis = 0x15;
                  local_7599 = 'I';
                  repeat = ntodo << 1;
                }
                else if (ncols == 0x20) {
                  naxis = 0x29;
                  local_7599 = 'J';
                  repeat = ntodo << 2;
                }
                else if (ncols == -0x20) {
                  naxis = 0x2a;
                  local_7599 = 'E';
                  repeat = ntodo << 2;
                }
                else {
                  if (ncols == -0x40) {
                    naxis = 0x52;
                    local_7599 = 'D';
                  }
                  else {
                    if (ncols != 0x40) {
                      ffpmsg("Error: the image has an invalid datatype.");
                      *status = 0xd3;
                      return 0xd3;
                    }
                    naxis = 0x51;
                    local_7599 = 'K';
                  }
                  repeat = ntodo << 3;
                }
                ffpmrk();
                ffgcno(newptr,0,colname,&bitpix,status);
                ffcmrk();
                if (*status == 0) {
                  ffgtdmll(newptr,bitpix,9,(int *)(naxes1 + 8),&repeat1,status);
                  if ((0 < *status) || (hdunum != (int)naxes1[8])) {
                    ffpmsg("Input image dimensions and output table cell dimensions do not match.");
                    *status = 0x140;
                    return 0x140;
                  }
                  for (colnum = 0; colnum < hdunum; colnum = colnum + 1) {
                    if (naxes[(long)colnum + -1] != naxes1[(long)colnum + -1]) {
                      ffpmsg("Input image dimensions and output table cell dimensions do not match."
                            );
                      *status = 0x140;
                      return 0x140;
                    }
                  }
                  ffgtclll(newptr,bitpix,(int *)((long)&headstart + 4),&width1,
                           (LONGLONG *)&stack0xffffffffffff84f8,status);
                  if (((0 < *status) || (headstart._4_4_ != naxis)) || (width1 != ntodo)) {
                    ffpmsg("Input image data type does not match output table cell type.");
                    *status = 0x105;
                    return 0x105;
                  }
                }
                else {
                  *status = 0;
                  snprintf(local_75b8,0x14,"%.0f%c",(double)ntodo,(ulong)(uint)(int)local_7599);
                  ffgncl(newptr,&stack0xffffffffffff8a6c,status);
                  bitpix = iStack_7594 + 1;
                  fficol(newptr,bitpix,colname,local_75b8,status);
                  ffptdmll(newptr,bitpix,hdunum,&nbytes,status);
                  if (*status != 0) {
                    ffpmsg("Could not insert new column into output table.");
                    return *status;
                  }
                }
                if (copykeyflag != 0) {
                  naxes1[8]._4_4_ = 0x2b;
                  if (copykeyflag == 2) {
                    patterns[0x2a][0] = "-";
                  }
                  fits_translate_keywords
                            (fptr,newptr,5,(char *(*) [2])&local_7dd8,0x2b,bitpix,0,0,status);
                }
                ffpcl(newptr,0xb,bitpix,rownum,ntodo,1,(void *)((long)&headstart + 3),status);
                buffer._29992_8_ = newptr->Fptr->tableptr + (bitpix + -1);
                local_7688 = ((tcolumn *)buffer._29992_8_)->tbcol + 1;
                ffghadll(fptr,&datastart,&dataend,(LONGLONG *)(patterns[0x2a] + 1),status);
                naxes[8] = dataend;
                snprintf((char *)&imgstart,0x51,
                         "HISTORY  Table column \'%s\' row %ld copied from image",colname,rownum);
                naxis1._0_1_ = 0;
                local_7598 = 0;
                strcpy((char *)&naxis1,"HISTORY   ");
                sVar3 = strlen((char *)&naxis1);
                ffflnm(fptr,(char *)((long)&naxis1 + sVar3),status);
                ffghdn(fptr,&local_7598);
                sVar3 = strlen((char *)&naxis1);
                sVar4 = strlen((char *)&naxis1);
                snprintf((char *)((long)&naxis1 + sVar3),0x415 - sVar4,"[%d]",
                         (ulong)(local_7598 - 1));
                ffflsh(fptr,0,status);
                ffmbyt(fptr,naxes[8],1,status);
                if (repeat < 0x7531) {
                  local_7e00 = repeat;
                }
                else {
                  local_7e00 = 30000;
                }
                ffgbyt(fptr,local_7e00,&hdutype,status);
                ffptbb(newptr,rownum,local_7688,local_7e00,(uchar *)&hdutype,status);
                repeat = repeat - local_7e00;
                local_7688 = local_7e00 + local_7688;
                while( true ) {
                  bVar1 = false;
                  if (repeat != 0) {
                    bVar1 = *status < 1;
                  }
                  if (!bVar1) break;
                  if (repeat < 0x7531) {
                    local_7e10 = repeat;
                  }
                  else {
                    local_7e10 = 30000;
                  }
                  ffread(fptr->Fptr,local_7e10,&hdutype,status);
                  ffptbb(newptr,rownum,local_7688,local_7e10,(uchar *)&hdutype,status);
                  repeat = repeat - local_7e10;
                  local_7688 = local_7e10 + local_7688;
                }
                ffrdef(newptr,status);
                fptr_local._4_4_ = *status;
              }
              else {
                ffpmsg("Could not read image parameters.");
                fptr_local._4_4_ = *status;
              }
            }
            else {
              ffpmsg("The output extension is not a table.");
              *status = 0xe3;
              fptr_local._4_4_ = 0xe3;
            }
          }
          else {
            ffpmsg("could not get output HDU type");
            fptr_local._4_4_ = *status;
          }
        }
        else {
          ffpmsg("The input extension is not an image.");
          ffpmsg(" Cannot open the image.");
          *status = 0xe9;
          fptr_local._4_4_ = 0xe9;
        }
      }
      else {
        ffpmsg("could not get input HDU type");
        fptr_local._4_4_ = *status;
      }
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int fits_copy_image2cell(
	   fitsfile *fptr,   /* I - pointer to input image extension */
	   fitsfile *newptr, /* I - pointer to output table */
           char *colname,    /* I - name of column containing the image    */
           long rownum,      /* I - number of the row containing the image */
           int copykeyflag,  /* I - controls which keywords to copy */
           int *status)      /* IO - error status */

/* 
   Copy an image extension into a table cell at a given row and
   column.  The table must have already been created.  If the "colname"
   column exists, it will be used, otherwise a new column will be created
   in the table.

   The "copykeyflag" parameter controls which keywords to copy from the 
   input image to the output table header (with any appropriate translation).
 
   copykeyflag = 0  -- no keywords will be copied
   copykeyflag = 1  -- essentially all keywords will be copied
   copykeyflag = 2  -- copy only the WCS related keywords 
   
  This routine was written by Craig Markwardt, GSFC

*/
{
    tcolumn *colptr;
    unsigned char buffer[30000];
    int ii, hdutype, colnum, typecode, bitpix, naxis, ncols, hdunum;
    char tformchar, tform[20], card[FLEN_CARD];
    LONGLONG imgstart, naxes[9], nbytes, repeat, ntodo,firstbyte;
    char filename[FLEN_FILENAME+20];

    int npat;

    int naxis1;
    LONGLONG naxes1[9] = {0,0,0,0,0,0,0,0,0}, repeat1, width1;
    int typecode1;
    unsigned char dummy = 0;

    LONGLONG headstart, datastart, dataend;

    /* Image-to-table keyword translation table  */
    /*                        INPUT      OUTPUT  */
    /*                       01234567   01234567 */
    char *patterns[][2] = {{"BSCALE",  "TSCALn"  },  /* Standard FITS keywords */
			   {"BZERO",   "TZEROn"  },
			   {"BUNIT",   "TUNITn"  },
			   {"BLANK",   "TNULLn"  },
			   {"DATAMIN", "TDMINn"  },
			   {"DATAMAX", "TDMAXn"  },
			   {"CTYPEi",  "iCTYPn"  },  /* Coordinate labels */
			   {"CTYPEia", "iCTYna"  },
			   {"CUNITi",  "iCUNIn"  },  /* Coordinate units */
			   {"CUNITia", "iCUNna"  },
			   {"CRVALi",  "iCRVLn"  },  /* WCS keywords */
			   {"CRVALia", "iCRVna"  },
			   {"CDELTi",  "iCDLTn"  },
			   {"CDELTia", "iCDEna"  },
			   {"CRPIXj",  "jCRPXn"  },
			   {"CRPIXja", "jCRPna"  },
			   {"PCi_ja",  "ijPCna"  },
			   {"CDi_ja",  "ijCDna"  },
			   {"PVi_ma",  "iVn_ma"  },
			   {"PSi_ma",  "iSn_ma"  },
			   {"WCSAXESa","WCAXna"  },
			   {"WCSNAMEa","WCSNna"  },
			   {"CRDERia", "iCRDna"  },
			   {"CSYERia", "iCSYna"  },
			   {"CROTAi",  "iCROTn"  },

			   {"LONPOLEa","LONPna"},
			   {"LATPOLEa","LATPna"},
			   {"EQUINOXa","EQUIna"},
			   {"MJD-OBS", "MJDOBn" },
			   {"MJD-AVG", "MJDAn" },
			   {"RADESYSa","RADEna"},
			   {"CNAMEia", "iCNAna"  },
			   {"DATE-AVG","DAVGn"},

			   {"NAXISi",  "-"       },  /* Remove structural keywords*/
			   {"PCOUNT",  "-"       },
			   {"GCOUNT",  "-"       },
			   {"EXTEND",  "-"       },
			   {"EXTNAME", "-"       },
			   {"EXTVER",  "-"       },
			   {"EXTLEVEL","-"       },
			   {"CHECKSUM","-"       },
			   {"DATASUM", "-"       },
			   {"*",       "+"       }}; /* copy all other keywords */

    
    if (*status > 0)
        return(*status);

    if (fptr == 0 || newptr == 0) return (*status = NULL_INPUT_PTR);

    if (ffghdt(fptr, &hdutype, status) > 0) {
      ffpmsg("could not get input HDU type");
      return (*status);
    }

    if (hdutype != IMAGE_HDU) {
        ffpmsg("The input extension is not an image.");
        ffpmsg(" Cannot open the image.");
        return(*status = NOT_IMAGE);
    }

    if (ffghdt(newptr, &hdutype, status) > 0) {
      ffpmsg("could not get output HDU type");
      return (*status);
    }

    if (hdutype != BINARY_TBL) {
        ffpmsg("The output extension is not a table.");
        return(*status = NOT_BTABLE);
    }


    if (ffgiprll(fptr, 9, &bitpix, &naxis, naxes, status) > 0) {
      ffpmsg("Could not read image parameters.");
      return (*status);
    }

    /* Determine total number of pixels in the image */
    repeat = 1;
    for (ii = 0; ii < naxis; ii++) repeat *= naxes[ii];

    /* Determine the TFORM value for the table cell */
    if (bitpix == BYTE_IMG) {
      typecode = TBYTE;
      tformchar = 'B';
      nbytes = repeat;
    } else if (bitpix == SHORT_IMG) {
      typecode = TSHORT;
      tformchar = 'I';
      nbytes = repeat*2;
    } else if (bitpix == LONG_IMG) {
      typecode = TLONG;
      tformchar = 'J';
      nbytes = repeat*4;
    } else if (bitpix == FLOAT_IMG) {
      typecode = TFLOAT;
      tformchar = 'E';
      nbytes = repeat*4;
    } else if (bitpix == DOUBLE_IMG) {
      typecode = TDOUBLE;
      tformchar = 'D';
      nbytes = repeat*8;
    } else if (bitpix == LONGLONG_IMG) {
      typecode = TLONGLONG;
      tformchar = 'K';
      nbytes = repeat*8;
    } else {
      ffpmsg("Error: the image has an invalid datatype.");
      return (*status = BAD_BITPIX);
    }

    /* get column number */
    ffpmrk();
    ffgcno(newptr, CASEINSEN, colname, &colnum, status);
    ffcmrk();

    /* Column does not exist; create it */
    if (*status) {

      *status = 0;
      snprintf(tform, 20, "%.0f%c", (double) repeat, tformchar);
      ffgncl(newptr, &ncols, status);
      colnum = ncols+1;
      fficol(newptr, colnum, colname, tform, status);
      ffptdmll(newptr, colnum, naxis, naxes, status);
      
      if (*status) {
	ffpmsg("Could not insert new column into output table.");
	return *status;
      }

    } else {

      ffgtdmll(newptr, colnum, 9, &naxis1, naxes1, status);
      if (*status > 0 || naxis != naxis1) {
	ffpmsg("Input image dimensions and output table cell dimensions do not match.");
	return (*status = BAD_DIMEN);
      }
      for (ii=0; ii<naxis; ii++) if (naxes[ii] != naxes1[ii]) {
	ffpmsg("Input image dimensions and output table cell dimensions do not match.");
	return (*status = BAD_DIMEN);
      }

      ffgtclll(newptr, colnum, &typecode1, &repeat1, &width1, status);
      if ((*status > 0) || (typecode1 != typecode) || (repeat1 != repeat)) {
	ffpmsg("Input image data type does not match output table cell type.");
	return (*status = BAD_TFORM);
      }
    }

    /* copy keywords from input image to output table, if required */
    
    if (copykeyflag) {
    
      npat = sizeof(patterns)/sizeof(patterns[0][0])/2;

      if (copykeyflag == 2) {   /* copy only the WCS-related keywords */
	patterns[npat-1][1] = "-";
      }

      /* The 3rd parameter value = 5 means skip the first 4 keywords in the image */
      fits_translate_keywords(fptr, newptr, 5, patterns, npat,
			      colnum, 0, 0, status);
    }

    /* Here is all the code to compute offsets:
     *     * byte offset from start of row to column (dest table)
     *     * byte offset from start of file to image data (source image)
     */   
 
    /* Force the writing of the row of the table by writing the last byte of
        the array, which grows the table, and/or shifts following extensions */
    ffpcl(newptr, TBYTE, colnum, rownum, repeat, 1, &dummy, status);

    /* byte offset within the row to the start of the image column */
    colptr  = (newptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */
    firstbyte = colptr->tbcol + 1; 

    /* get starting address of input image to be read */
    ffghadll(fptr, &headstart, &datastart, &dataend, status);
    imgstart = datastart;

    snprintf(card, FLEN_CARD, "HISTORY  Table column '%s' row %ld copied from image",
	    colname, rownum);
/*
  Don't automatically write History keywords; leave this up to the caller. 
    ffprec(newptr, card, status);
*/

    /* write HISTORY keyword with the file name (this is now disabled)*/

    filename[0] = '\0'; hdunum = 0;
    strcpy(filename, "HISTORY   ");
    ffflnm(fptr, filename+strlen(filename), status);
    ffghdn(fptr, &hdunum);
    snprintf(filename+strlen(filename),FLEN_FILENAME+20-strlen(filename),"[%d]", hdunum-1);
/*
    ffprec(newptr, filename, status);
*/

    /* the use of ffread routine, below, requires that any 'dirty' */
    /* buffers in memory be flushed back to the file first */
    
    ffflsh(fptr, FALSE, status);

    /* move to the first byte of the input image */
    ffmbyt(fptr, imgstart, TRUE, status);

    ntodo = minvalue(30000L, nbytes);
    ffgbyt(fptr, ntodo, buffer, status);  /* read input image */
    ffptbb(newptr, rownum, firstbyte, ntodo, buffer, status); /* write to table */

    nbytes    -= ntodo;
    firstbyte += ntodo;


    /* read any additional bytes with low-level ffread routine, for speed */
    while (nbytes && (*status <= 0) )
    {
        ntodo = minvalue(30000L, nbytes);
        ffread(fptr->Fptr, (long) ntodo, buffer, status);
        ffptbb(newptr, rownum, firstbyte, ntodo, buffer, status);
        nbytes    -= ntodo;
        firstbyte += ntodo;
    }

    /* Re-scan the header so that CFITSIO knows about all the new keywords */
    ffrdef(newptr,status);

    return(*status);
}